

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxc.cxx
# Opt level: O0

void __thiscall
ExchCXX::detail::LibxcKernelImpl::eval_exc_vxc_
          (LibxcKernelImpl *this,int N,const_host_buffer_type rho,const_host_buffer_type sigma,
          host_buffer_type eps,host_buffer_type vrho,host_buffer_type vsigma)

{
  bool bVar1;
  undefined8 uVar2;
  xc_func_type *in_RCX;
  undefined4 in_ESI;
  size_t in_R8;
  double *in_R9;
  string *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  string *in_stack_ffffffffffffff88;
  exchcxx_exception *in_stack_ffffffffffffff90;
  double *in_stack_ffffffffffffffb8;
  LibxcKernelImpl *in_stack_ffffffffffffffc0;
  double *in_stack_ffffffffffffffc8;
  undefined4 in_stack_fffffffffffffff0;
  
  throw_if_uninitialized(in_stack_ffffffffffffffc0);
  bVar1 = XCKernelImpl::is_gga((XCKernelImpl *)0x25f21a);
  if (!bVar1) {
    uVar2 = __cxa_allocate_exception(0x50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88,
               (allocator<char> *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88,
               (allocator<char> *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    exchcxx_exception::exchcxx_exception
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
               in_stack_ffffffffffffff78);
    __cxa_throw(uVar2,&exchcxx_exception::typeinfo,exchcxx_exception::~exchcxx_exception);
  }
  xc_gga_exc_vxc(in_RCX,in_R8,in_R9,in_stack_ffffffffffffffc8,(double *)in_stack_ffffffffffffffc0,
                 in_stack_ffffffffffffffb8,(double *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  return;
}

Assistant:

GGA_EXC_VXC_GENERATOR( LibxcKernelImpl::eval_exc_vxc_ ) const {

  throw_if_uninitialized();
  EXCHCXX_BOOL_CHECK("KERNEL IS NOT GGA",  is_gga() );
  xc_gga_exc_vxc( &kernel_, N, rho, sigma, eps, vrho, vsigma );

}